

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

Error __thiscall asmjit::ZoneBitVector::_append(ZoneBitVector *this,ZoneHeap *heap,bool value)

{
  ulong uVar1;
  Error EVar2;
  ulong idealCapacity;
  size_t newLength;
  
  uVar1 = *(ulong *)(this + 0x10);
  idealCapacity = 0x80;
  if (0x7f < uVar1) {
    if (uVar1 < 0x4000001) {
      idealCapacity = uVar1 * 2;
    }
    else {
      idealCapacity = uVar1 + 0x4000000;
    }
  }
  newLength = *(long *)(this + 8) + 1;
  if ((idealCapacity < uVar1) && (idealCapacity = newLength, newLength <= uVar1)) {
    _append();
  }
  EVar2 = _resize(this,heap,newLength,idealCapacity,value);
  return EVar2;
}

Assistant:

Error ZoneBitVector::_append(ZoneHeap* heap, bool value) noexcept {
  size_t kThreshold = Globals::kAllocThreshold * 8;
  size_t newLength = _length + 1;
  size_t idealCapacity = _capacity;

  if (idealCapacity < 128)
    idealCapacity = 128;
  else if (idealCapacity <= kThreshold)
    idealCapacity *= 2;
  else
    idealCapacity += kThreshold;

  if (ASMJIT_UNLIKELY(idealCapacity < _capacity)) {
    // It's technically impossible that `_length + 1` overflows.
    idealCapacity = newLength;
    ASMJIT_ASSERT(idealCapacity > _capacity);
  }

  return _resize(heap, newLength, idealCapacity, value);
}